

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
     object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = (ulong)num * 0x44; lVar1 != 0; lVar1 = lVar1 + -0x44) {
    threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec::weighted_vec
              ((weighted_vec *)pDst_void,(weighted_vec *)pSrc_void);
    pSrc_void = (void *)((long)pSrc_void + 0x44);
    pDst_void = (void *)((long)pDst_void + 0x44);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }